

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

Ptr __thiscall core::image::load_jpg_file(image *this,string *filename,string *exif)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  FileException *this_00;
  int *piVar4;
  char *msg;
  Exception *pEVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar6;
  code *local_398;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [3];
  FILE *local_40;
  allocator local_31;
  
  local_40 = fopen((filename->_M_dataplus)._M_p,"rb");
  if (local_40 == (FILE *)0x0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar4 = __errno_location();
    msg = strerror(*piVar4);
    util::FileException::FileException(this_00,filename,msg);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  jerr._160_8_ = jpeg_std_error(&local_398);
  local_398 = jpg_error_handler;
  jerr.error_exit = jpg_message_handler;
  jpeg_CreateDecompress(&jerr.first_addon_message,0x50,0x290);
  jpeg_stdio_src(&jerr.first_addon_message,local_40);
  if (exif != (string *)0x0) {
    jpeg_save_markers(&jerr.first_addon_message,0xe1,0xffff);
  }
  iVar3 = jpeg_read_header(&jerr.first_addon_message,0);
  if (iVar3 == 1) {
    if ((((exif != (string *)0x0) && (cinfo._392_8_ != 0)) &&
        (*(char *)(cinfo._392_8_ + 8) == -0x1f)) && (6 < *(uint *)(cinfo._392_8_ + 0x10))) {
      bVar2 = std::__equal<false>::equal<unsigned_char*,char_const*>
                        (*(uchar **)(cinfo._392_8_ + 0x18),*(uchar **)(cinfo._392_8_ + 0x18) + 6,
                         "Exif");
      if (bVar2) {
        std::__cxx11::string::append<char_const*,void>
                  ((string *)exif,*(char **)(cinfo._392_8_ + 0x18),
                   *(char **)(cinfo._392_8_ + 0x18) + *(uint *)(cinfo._392_8_ + 0x10));
      }
    }
    if (0xfffffffd < cinfo.num_components - 3U) {
      iVar3 = (uint)(cinfo.num_components == 2) * 2 + 1;
      Image<unsigned_char>::create
                ((Image<unsigned_char> *)&cinfo.cquantize,(int)cinfo.src,cinfo.src._4_4_,iVar3);
      std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
                 &cinfo.cquantize);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
      lVar1 = *(long *)this;
      jpeg_start_decompress(&jerr.first_addon_message);
      cinfo.cquantize = *(jpeg_color_quantizer **)(lVar1 + 0x18);
      while ((uint)cinfo.colormap < (uint)cinfo.enable_2pass_quant) {
        jpeg_read_scanlines(&jerr.first_addon_message,&cinfo.cquantize,1);
        cinfo.cquantize = cinfo.cquantize + (uint)(cinfo.enable_external_quant * iVar3);
      }
      jpeg_finish_decompress(&jerr.first_addon_message);
      jpeg_destroy_decompress(&jerr.first_addon_message);
      fclose(local_40);
      PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
    }
    pEVar5 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&cinfo.cquantize,"Invalid JPEG color space",&local_31);
    util::Exception::Exception(pEVar5,(string *)&cinfo.cquantize);
    __cxa_throw(pEVar5,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  pEVar5 = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&cinfo.cquantize,"JPEG header not recognized",&local_31);
  util::Exception::Exception(pEVar5,(string *)&cinfo.cquantize);
  __cxa_throw(pEVar5,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

ByteImage::Ptr
load_jpg_file (std::string const& filename, std::string* exif)
{
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    jpeg_decompress_struct cinfo;
    jpeg_error_mgr jerr;
    ByteImage::Ptr image;
    try
    {
        /* Setup error handler and JPEG reader. */
        cinfo.err = jpeg_std_error(&jerr);
        jerr.error_exit = &jpg_error_handler;
        jerr.emit_message = &jpg_message_handler;
        jpeg_create_decompress(&cinfo);
        jpeg_stdio_src(&cinfo, fp);

        if (exif)
        {
            /* Request APP1 marker to be saved (this is the EXIF data). */
            jpeg_save_markers(&cinfo, JPEG_APP0 + 1, 0xffff);
        }

        /* Read JPEG header. */
        int ret = jpeg_read_header(&cinfo, static_cast<boolean>(false));
        if (ret != JPEG_HEADER_OK)
            throw util::Exception("JPEG header not recognized");

        /* Examine JPEG markers. */
        if (exif)
        {
            jpeg_saved_marker_ptr marker = cinfo.marker_list;
            if (marker != nullptr && marker->marker == JPEG_APP0 + 1
                && marker->data_length > 6
                && std::equal(marker->data, marker->data + 6, "Exif\0\0"))
            {
                char const* data = reinterpret_cast<char const*>(marker->data);
                exif->append(data, data + marker->data_length);
            }
        }

        if (cinfo.out_color_space != JCS_GRAYSCALE
            && cinfo.out_color_space != JCS_RGB)
            throw util::Exception("Invalid JPEG color space");

        /* Create image. */
        int const width = cinfo.image_width;
        int const height = cinfo.image_height;
        int const channels = (cinfo.out_color_space == JCS_RGB ? 3 : 1);
        image = ByteImage::create(width, height, channels);
        ByteImage::ImageData& data = image->get_data();

        /* Start decompression. */
        jpeg_start_decompress(&cinfo);

        unsigned char* data_ptr = &data[0];
        while (cinfo.output_scanline < cinfo.output_height)
        {
            jpeg_read_scanlines(&cinfo, &data_ptr, 1);
            data_ptr += channels * cinfo.output_width;
        }

        /* Shutdown JPEG decompression. */
        jpeg_finish_decompress(&cinfo);
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
    }
    catch (...)
    {
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
        throw;
    }

    return image;
}